

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O1

int mpi_select(mbedtls_mpi *R,mbedtls_mpi *T,size_t T_size,size_t idx)

{
  int iVar1;
  ulong uVar2;
  
  if (T_size == 0) {
    return -0x6e;
  }
  uVar2 = 0;
  do {
    iVar1 = mbedtls_mpi_safe_cond_assign
                      (R,T,~((char)((byte)(-(idx ^ uVar2) >> 0x38) | (byte)((idx ^ uVar2) >> 0x38))
                            >> 7));
    if (iVar1 != 0) {
      return iVar1;
    }
    uVar2 = uVar2 + 1;
    T = T + 1;
  } while (T_size != uVar2);
  return 0;
}

Assistant:

static int mpi_select(mbedtls_mpi *R, const mbedtls_mpi *T, size_t T_size, size_t idx)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;

    for (size_t i = 0; i < T_size; i++) {
        MBEDTLS_MPI_CHK(mbedtls_mpi_safe_cond_assign(R, &T[i],
                                                     (unsigned char) mbedtls_ct_uint_eq(i, idx)));
    }
cleanup:
    return ret;
}